

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathDebugDumpNodeList(FILE *output,xmlNodePtr cur,int depth)

{
  _xmlNode *p_Var1;
  undefined1 local_98 [8];
  char shift [100];
  int local_2c;
  int i;
  xmlNodePtr tmp;
  xmlNodePtr pxStack_18;
  int depth_local;
  xmlNodePtr cur_local;
  FILE *output_local;
  
  for (local_2c = 0; local_2c < depth && local_2c < 0x19; local_2c = local_2c + 1) {
    local_98[local_2c * 2 + 1] = 0x20;
    local_98[local_2c << 1] = 0x20;
  }
  local_98[local_2c * 2 + 1] = 0;
  local_98[local_2c << 1] = 0;
  pxStack_18 = cur;
  if (cur == (xmlNodePtr)0x0) {
    fprintf((FILE *)output,"%s",local_98);
    fprintf((FILE *)output,"Node is NULL !\n");
  }
  else {
    while (pxStack_18 != (xmlNodePtr)0x0) {
      p_Var1 = pxStack_18->next;
      xmlDebugDumpOneNode(output,pxStack_18,depth);
      pxStack_18 = p_Var1;
    }
  }
  return;
}

Assistant:

static void
xmlXPathDebugDumpNodeList(FILE *output, xmlNodePtr cur, int depth) {
    xmlNodePtr tmp;
    int i;
    char shift[100];

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;
    if (cur == NULL) {
	fprintf(output, "%s", shift);
	fprintf(output, "Node is NULL !\n");
	return;

    }

    while (cur != NULL) {
	tmp = cur;
	cur = cur->next;
	xmlDebugDumpOneNode(output, tmp, depth);
    }
}